

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

deUint32 __thiscall
sglr::ReferenceContext::createProgram(ReferenceContext *this,ShaderProgram *program)

{
  deUint32 name_00;
  ShaderProgramObjectContainer *this_00;
  int name;
  ShaderProgram *program_local;
  ReferenceContext *this_local;
  
  name_00 = rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::allocateName
                      (&this->m_programs);
  this_00 = (ShaderProgramObjectContainer *)operator_new(0x20);
  rc::ShaderProgramObjectContainer::ShaderProgramObjectContainer(this_00,name_00,program);
  rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::insert(&this->m_programs,this_00);
  return name_00;
}

Assistant:

deUint32 ReferenceContext::createProgram (ShaderProgram* program)
{
	int name = m_programs.allocateName();

	m_programs.insert(new rc::ShaderProgramObjectContainer(name, program));

	return name;
}